

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

Orientations __thiscall
QGridLayoutPrivate::expandingDirections(QGridLayoutPrivate *this,int hSpacing,int vSpacing)

{
  bool *pbVar1;
  uint uVar2;
  QFlagsStorage<Qt::Orientation> QVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  setupLayoutData(this,hSpacing,vSpacing);
  uVar2 = this->rr;
  if (this->rr < 1) {
    uVar2 = 0;
  }
  lVar6 = 0;
  do {
    QVar3.i = 0;
    if ((ulong)uVar2 * 0x20 + 0x20 == lVar6 + 0x20) break;
    pbVar1 = &((this->rowData).d.ptr)->expansive + lVar6;
    lVar6 = lVar6 + 0x20;
    QVar3.i = 2;
  } while (*pbVar1 != true);
  uVar4 = (ulong)(uint)this->cc;
  if (this->cc < 1) {
    uVar4 = 0;
  }
  uVar5 = 0;
  do {
    if (uVar4 * 0x20 + 0x20 == uVar5 + 0x20) {
      return (Orientations)QVar3.i;
    }
    pbVar1 = &((this->colData).d.ptr)->expansive + uVar5;
    uVar5 = uVar5 + 0x20;
  } while (*pbVar1 != true);
  return (QFlagsStorageHelper<Qt::Orientation,_4>)
         (QFlagsStorageHelper<Qt::Orientation,_4>)(QVar3.i | 1);
}

Assistant:

Qt::Orientations QGridLayoutPrivate::expandingDirections(int hSpacing, int vSpacing) const
{
    QGridLayoutPrivate *that = const_cast<QGridLayoutPrivate*>(this);
    that->setupLayoutData(hSpacing, vSpacing);
    Qt::Orientations ret;

    for (int r = 0; r < rr; r++) {
        if (rowData.at(r).expansive) {
            ret |= Qt::Vertical;
            break;
        }
    }
    for (int c = 0; c < cc; c++) {
        if (colData.at(c).expansive) {
            ret |= Qt::Horizontal;
            break;
        }
    }
    return ret;
}